

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_set_skip_loop_filter(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    piVar3 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    piVar3 = (int *)args->overflow_arg_area;
    args->overflow_arg_area = piVar3 + 2;
  }
  iVar2 = *piVar3;
  ctx->skip_loop_filter = iVar2;
  if (ctx->frame_worker != (AVxWorker *)0x0) {
    *(int *)(*ctx->frame_worker->data1 + 0x5f724) = iVar2;
  }
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_set_skip_loop_filter(aom_codec_alg_priv_t *ctx,
                                                 va_list args) {
  ctx->skip_loop_filter = va_arg(args, int);

  if (ctx->frame_worker) {
    AVxWorker *const worker = ctx->frame_worker;
    FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;
    frame_worker_data->pbi->skip_loop_filter = ctx->skip_loop_filter;
  }

  return AOM_CODEC_OK;
}